

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBCore.c
# Opt level: O1

void Bmc_ManBCoreCollect_rec(Gia_Man_t *p,int Id,int f,Vec_Int_t *vNodes,Vec_Int_t *vRootsNew)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  
  do {
    if (p->nTravIdsAlloc <= Id) {
      __assert_fail("Id < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x268,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
    }
    if (p->pTravIds[Id] == p->nTravIds) {
      return;
    }
    p->pTravIds[Id] = p->nTravIds;
    if ((Id < 0) || (iVar1 = p->nObjs, iVar1 <= Id)) {
LAB_0055e87b:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    if (vNodes->nSize < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    pGVar6 = p->pObjs + (uint)Id;
    pGVar6->Value = (uint)vNodes->nSize >> 1;
    if (iVar1 <= Id) {
LAB_0055e85c:
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    Vec_IntPush(vNodes,Id);
    Vec_IntPush(vNodes,f);
    uVar5 = (uint)*(undefined8 *)pGVar6;
    if ((uVar5 & 0x9fffffff) == 0x9fffffff) {
      uVar4 = (uint)((ulong)*(undefined8 *)pGVar6 >> 0x20);
      if ((int)(uVar4 & 0x1fffffff) < p->vCis->nSize - p->nRegs) {
        return;
      }
      if (p->vCis->nSize - p->nRegs <= (int)(uVar4 & 0x1fffffff)) {
        iVar1 = p->vCis->nSize;
        if ((int)(uVar4 & 0x1fffffff) < iVar1 - p->nRegs) {
          __assert_fail("Gia_ObjIsRo(p, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar2 = p->vCos->nSize;
        uVar5 = (iVar2 - iVar1) + (uVar4 & 0x1fffffff);
        if (((int)uVar5 < 0) || (iVar2 <= (int)uVar5)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = p->vCos->pArray[uVar5];
        if ((-1 < iVar1) && (iVar1 < p->nObjs)) {
          Vec_IntPush(vRootsNew,iVar1);
          return;
        }
        goto LAB_0055e87b;
      }
    }
    if (((int)uVar5 < 0) || ((uVar5 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBCore.c"
                    ,0x71,
                    "void Bmc_ManBCoreCollect_rec(Gia_Man_t *, int, int, Vec_Int_t *, Vec_Int_t *)")
      ;
    }
    pGVar3 = p->pObjs;
    if ((pGVar6 < pGVar3) || (pGVar3 + p->nObjs <= pGVar6)) goto LAB_0055e85c;
    Bmc_ManBCoreCollect_rec
              (p,(int)((ulong)((long)pGVar6 - (long)pGVar3) >> 2) * -0x55555555 -
                 (uVar5 & 0x1fffffff),f,vNodes,vRootsNew);
    pGVar3 = p->pObjs;
    if ((pGVar6 < pGVar3) || (pGVar3 + p->nObjs <= pGVar6)) goto LAB_0055e85c;
    Id = (int)((ulong)((long)pGVar6 - (long)pGVar3) >> 2) * -0x55555555 -
         (*(uint *)&pGVar6->field_0x4 & 0x1fffffff);
  } while( true );
}

Assistant:

void Bmc_ManBCoreCollect_rec( Gia_Man_t * p, int Id, int f, Vec_Int_t * vNodes, Vec_Int_t * vRootsNew )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, Id) )
        return;
    Gia_ObjSetTravIdCurrentId(p, Id);
    pObj = Gia_ManObj( p, Id );
    Bmc_ManBCoreAssignVar( p, pObj, f, vNodes );
    if ( Gia_ObjIsPi(p, pObj) )
        return;
    if ( Gia_ObjIsRo(p, pObj) )
    {
        Vec_IntPush( vRootsNew, Gia_ObjId(p, Gia_ObjRoToRi(p, pObj)) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Bmc_ManBCoreCollect_rec( p, Gia_ObjFaninId0p(p, pObj), f, vNodes, vRootsNew );
    Bmc_ManBCoreCollect_rec( p, Gia_ObjFaninId1p(p, pObj), f, vNodes, vRootsNew );
}